

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O2

void __thiscall CaDiCaL::Proof::conclude_sat(Proof *this,vector<int,_std::allocator<int>_> *model)

{
  pointer ppTVar1;
  Tracer **tracer;
  pointer ppTVar2;
  
  ppTVar1 = (this->tracers).
            super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar2 = (this->tracers).
                 super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar2 != ppTVar1; ppTVar2 = ppTVar2 + 1) {
    (*(*ppTVar2)->_vptr_Tracer[0x10])(*ppTVar2,model);
  }
  return;
}

Assistant:

void Proof::conclude_sat (const vector<int> &model) {
  LOG (clause, "PROOF conclude sat");
  for (auto &tracer : tracers) {
    tracer->conclude_sat (model);
  }
}